

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::TParseContext::updateBindlessQualifier(TParseContext *this,TType *memberType)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *this_00;
  size_type sVar4;
  reference pvVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TType *subMemberType;
  uint member;
  TTypeList *typeList;
  TType *memberType_local;
  TParseContext *this_local;
  
  uVar2 = (*memberType->_vptr_TType[0x37])();
  if ((uVar2 & 1) != 0) {
    uVar2 = (*memberType->_vptr_TType[0x25])();
    if ((uVar2 & 1) == 0) {
      iVar3 = (*memberType->_vptr_TType[9])();
      bVar1 = TSampler::isImage((TSampler *)CONCAT44(extraout_var,iVar3));
      if (bVar1) {
        TIntermediate::setBindlessImageMode
                  ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                   &this->currentCaller,AstRefTypeLayout);
        iVar3 = (*memberType->_vptr_TType[10])();
        *(undefined1 *)(CONCAT44(extraout_var_00,iVar3) + 0x49) = 1;
      }
      else {
        TIntermediate::setBindlessTextureMode
                  ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                   &this->currentCaller,AstRefTypeLayout);
        iVar3 = (*memberType->_vptr_TType[10])();
        *(undefined1 *)(CONCAT44(extraout_var_01,iVar3) + 0x48) = 1;
      }
    }
    else {
      this_00 = &TType::getWritableStruct(memberType)->
                 super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
      for (subMemberType._4_4_ = 0;
          sVar4 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::size
                            (this_00), subMemberType._4_4_ < sVar4;
          subMemberType._4_4_ = subMemberType._4_4_ + 1) {
        pvVar5 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                 operator[](this_00,(ulong)subMemberType._4_4_);
        updateBindlessQualifier(this,pvVar5->type);
      }
    }
  }
  return;
}

Assistant:

void TParseContext::updateBindlessQualifier(TType& memberType)
{
    if (memberType.containsSampler()) {
        if (memberType.isStruct()) {
            TTypeList* typeList = memberType.getWritableStruct();
            for (unsigned int member = 0; member < typeList->size(); ++member) {
                TType* subMemberType = (*typeList)[member].type;
                updateBindlessQualifier(*subMemberType);
            }
        }
        else if (memberType.getSampler().isImage()) {
            intermediate.setBindlessImageMode(currentCaller, AstRefTypeLayout);
            memberType.getQualifier().layoutBindlessImage = true;
        }
        else {
            intermediate.setBindlessTextureMode(currentCaller, AstRefTypeLayout);
            memberType.getQualifier().layoutBindlessSampler = true;
        }
    }
}